

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string * lest::to_string<bool>(bool *value)

{
  string *in_RDI;
  bool *in_stack_00000168;
  string local_30 [48];
  
  string_maker<bool>::to_string_abi_cxx11_(in_stack_00000168);
  std::__cxx11::string::string(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

inline std::string to_string( T const & value )
{
    return string_maker<T>::to_string( value );
}